

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

CmpResultSet
tcu::execCompare(CompareMode compareMode,float cmpValue_,float cmpReference_,int referenceBits,
                bool isFixedPoint)

{
  ushort uVar1;
  ushort uVar2;
  undefined7 in_register_00000011;
  float fVar3;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Db;
  undefined1 auVar4 [16];
  
  if ((int)CONCAT71(in_register_00000011,isFixedPoint) != 0) {
    auVar4._4_4_ = cmpReference_;
    auVar4._0_4_ = cmpValue_;
    auVar4._8_4_ = in_XMM0_Db;
    auVar4._12_4_ = in_XMM1_Db;
    auVar4 = minps(_DAT_0166f150,auVar4);
    cmpValue_ = (float)(-(uint)(0.0 <= cmpValue_) & auVar4._0_4_);
    cmpReference_ = (float)(-(uint)(0.0 <= cmpReference_) & auVar4._4_4_);
  }
  fVar3 = TexVerifierUtil::computeFixedPointError(referenceBits);
  uVar1 = 0;
  switch(compareMode) {
  case COMPAREMODE_LESS:
    uVar1 = (ushort)(cmpReference_ - fVar3 < cmpValue_);
    if (cmpReference_ + fVar3 < cmpValue_) goto switchD_0161b318_default;
    break;
  case COMPAREMODE_LESS_OR_EQUAL:
    uVar1 = (ushort)(cmpReference_ - fVar3 <= cmpValue_);
    if (cmpReference_ + fVar3 <= cmpValue_) goto switchD_0161b318_default;
    break;
  case COMPAREMODE_GREATER:
    uVar1 = (ushort)(cmpValue_ < cmpReference_ + fVar3);
    if (cmpValue_ < cmpReference_ - fVar3) goto switchD_0161b318_default;
    break;
  case COMPAREMODE_GREATER_OR_EQUAL:
    uVar1 = (ushort)(cmpValue_ <= cmpReference_ + fVar3);
    if (cmpValue_ <= cmpReference_ - fVar3) goto switchD_0161b318_default;
    break;
  case COMPAREMODE_EQUAL:
    uVar1 = -(ushort)(cmpValue_ <= cmpReference_ + fVar3 && cmpReference_ - fVar3 <= cmpValue_);
    if ((((cmpValue_ == cmpReference_) && (!NAN(cmpValue_) && !NAN(cmpReference_))) &&
        (fVar3 == 0.0)) && (!NAN(fVar3))) goto switchD_0161b318_default;
    break;
  case COMPAREMODE_NOT_EQUAL:
    uVar1 = -(ushort)(fVar3 != 0.0 || cmpValue_ != cmpReference_);
    if (cmpReference_ + fVar3 < cmpValue_ || cmpValue_ < cmpReference_ - fVar3)
    goto switchD_0161b318_default;
    break;
  case COMPAREMODE_ALWAYS:
    uVar1 = 1;
  default:
switchD_0161b318_default:
    uVar2 = 0;
    goto LAB_0161b43e;
  case COMPAREMODE_NEVER:
    break;
  }
  uVar2 = 0x100;
LAB_0161b43e:
  return (CmpResultSet)(uVar2 | uVar1 & 1);
}

Assistant:

static CmpResultSet execCompare (const Sampler::CompareMode	compareMode,
								 const float				cmpValue_,
								 const float				cmpReference_,
								 const int					referenceBits,
								 const bool					isFixedPoint)
{
	const bool		clampValues		= isFixedPoint;	// if comparing against a floating point texture, ref (and value) is not clamped
	const float		cmpValue		= (clampValues) ? (de::clamp(cmpValue_, 0.0f, 1.0f)) : (cmpValue_);
	const float		cmpReference	= (clampValues) ? (de::clamp(cmpReference_, 0.0f, 1.0f)) : (cmpReference_);
	const float		err				= computeFixedPointError(referenceBits);
	CmpResultSet	res;

	switch (compareMode)
	{
		case Sampler::COMPAREMODE_LESS:
			res.isTrue	= cmpReference-err < cmpValue;
			res.isFalse	= cmpReference+err >= cmpValue;
			break;

		case Sampler::COMPAREMODE_LESS_OR_EQUAL:
			res.isTrue	= cmpReference-err <= cmpValue;
			res.isFalse	= cmpReference+err > cmpValue;
			break;

		case Sampler::COMPAREMODE_GREATER:
			res.isTrue	= cmpReference+err > cmpValue;
			res.isFalse	= cmpReference-err <= cmpValue;
			break;

		case Sampler::COMPAREMODE_GREATER_OR_EQUAL:
			res.isTrue	= cmpReference+err >= cmpValue;
			res.isFalse	= cmpReference-err < cmpValue;
			break;

		case Sampler::COMPAREMODE_EQUAL:
			res.isTrue	= de::inRange(cmpValue, cmpReference-err, cmpReference+err);
			res.isFalse	= err != 0.0f || cmpValue != cmpReference;
			break;

		case Sampler::COMPAREMODE_NOT_EQUAL:
			res.isTrue	= err != 0.0f || cmpValue != cmpReference;
			res.isFalse	= de::inRange(cmpValue, cmpReference-err, cmpReference+err);
			break;

		case Sampler::COMPAREMODE_ALWAYS:
			res.isTrue	= true;
			break;

		case Sampler::COMPAREMODE_NEVER:
			res.isFalse	= true;
			break;

		default:
			DE_ASSERT(false);
	}

	DE_ASSERT(res.isTrue || res.isFalse);
	return res;
}